

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O0

Matrix * lookat(Matrix *__return_storage_ptr__,Vec3f *eye,Vec3f *center,Vec3f *up)

{
  float fVar1;
  Vec3<float> *pVVar2;
  float *pfVar3;
  vector<float,_std::allocator<float>_> *pvVar4;
  reference pvVar5;
  int local_78;
  int i;
  undefined1 local_64 [8];
  Vec3f y;
  undefined1 local_4c [8];
  Vec3f x;
  undefined1 local_34 [8];
  Vec3f z;
  Vec3f *up_local;
  Vec3f *center_local;
  Vec3f *eye_local;
  Matrix *ret;
  
  z._4_8_ = up;
  Vec3<float>::operator-((Vec3<float> *)&x.y,eye);
  pVVar2 = Vec3<float>::normalize((Vec3<float> *)&x.y,1.0);
  Vec3<float>::Vec3((Vec3<float> *)local_34,pVVar2);
  Vec3<float>::operator^((Vec3<float> *)&y.y,up);
  pVVar2 = Vec3<float>::normalize((Vec3<float> *)&y.y,1.0);
  Vec3<float>::Vec3((Vec3<float> *)local_4c,pVVar2);
  Vec3<float>::operator^((Vec3<float> *)&i,(Vec3<float> *)local_34);
  pVVar2 = Vec3<float>::normalize((Vec3<float> *)&i,1.0);
  Vec3<float>::Vec3((Vec3<float> *)local_64,pVVar2);
  Matrix::identity(__return_storage_ptr__,4);
  for (local_78 = 0; local_78 < 3; local_78 = local_78 + 1) {
    pfVar3 = Vec3<float>::operator[]((Vec3<float> *)local_4c,local_78);
    fVar1 = *pfVar3;
    pvVar4 = Matrix::operator[](__return_storage_ptr__,0);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar4,(long)local_78);
    *pvVar5 = fVar1;
    pfVar3 = Vec3<float>::operator[]((Vec3<float> *)local_64,local_78);
    fVar1 = *pfVar3;
    pvVar4 = Matrix::operator[](__return_storage_ptr__,1);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar4,(long)local_78);
    *pvVar5 = fVar1;
    pfVar3 = Vec3<float>::operator[]((Vec3<float> *)local_34,local_78);
    fVar1 = *pfVar3;
    pvVar4 = Matrix::operator[](__return_storage_ptr__,2);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar4,(long)local_78);
    *pvVar5 = fVar1;
    pfVar3 = Vec3<float>::operator[](center,local_78);
    fVar1 = *pfVar3;
    pvVar4 = Matrix::operator[](__return_storage_ptr__,local_78);
    pvVar5 = std::vector<float,_std::allocator<float>_>::operator[](pvVar4,3);
    *pvVar5 = -fVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix lookat(Vec3f eye, Vec3f center, Vec3f up) {
    Vec3f z = (eye-center).normalize();
    Vec3f x = (up^z).normalize();
    Vec3f y = (z^x).normalize();
    Matrix ret = Matrix::identity(4);
    for (int i=0; i<3; i++) {
        ret[0][i] = x[i];
        ret[1][i] = y[i];
        ret[2][i] = z[i];
        ret[i][3] = -center[i];
    }
    return ret;
}